

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O2

SDKConnection * __thiscall MyClient::OnP2PConnectionStart(MyClient *this,TonkAddress *param_1)

{
  shared_ptr<MyP2PClientConnection> shared;
  MyClient *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  MyClient *local_18;
  
  this->StartedP2PConnection = true;
  local_18 = this;
  std::make_shared<MyP2PClientConnection,MyClient*>(&local_28);
  tonk::SDKConnectionList<MyP2PClientConnection>::Insert
            (&this->P2PClientList,(SDKConnection *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return (SDKConnection *)local_28;
}

Assistant:

tonk::SDKConnection* MyClient::OnP2PConnectionStart(const TonkAddress& /*address*/)
{
    StartedP2PConnection = true;

    auto shared = std::make_shared<MyP2PClientConnection>(this);
    P2PClientList.Insert(shared.get());
    return shared.get();
}